

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrLib.cpp
# Opt level: O0

char * nv::Path::extension(char *str)

{
  char cVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  bool bVar5;
  int local_1c;
  int l;
  int length;
  char *str_local;
  
  if ((str == (char *)0x0) &&
     (iVar3 = nvAbort("str != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvcore/StrLib.cpp"
                      ,0x213,"static const char *nv::Path::extension(const char *)"), iVar3 == 1)) {
    raise(5);
  }
  sVar4 = strlen(str);
  iVar3 = (int)sVar4;
  local_1c = iVar3;
  while( true ) {
    bVar5 = false;
    if (0 < local_1c) {
      bVar5 = str[local_1c] != '.';
    }
    if (!bVar5) break;
    local_1c = local_1c + -1;
    cVar1 = str[local_1c];
    cVar2 = separator();
    if (cVar1 == cVar2) {
      return str + iVar3;
    }
  }
  if (local_1c == 0) {
    return str + iVar3;
  }
  return str + local_1c;
}

Assistant:

const char * Path::extension(const char * str)
{
	nvCheck( str != NULL );

	int length, l;
	l = length = (int)strlen( str );
	while( length > 0 && str[length] != '.' ) {
		length--;
		if( str[length] == separator() ) {
			return &str[l];		// no extension
		}
	}
	if( length == 0 ) {
		return &str[l];
	}
	return &str[length];
}